

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks4.c
# Opt level: O0

void proxy_socks4_process_queue(ProxyNegotiator *pn)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  byte local_235;
  byte local_234;
  uchar data [8];
  char addr [4];
  _Bool write_hostname;
  char hostname [512];
  int *crLine;
  Socks4ProxyNegotiator *s;
  ProxyNegotiator *pn_local;
  
  iVar2._0_1_ = pn[-1].aborted;
  iVar2._1_1_ = pn[-1].reconnect;
  iVar2._2_2_ = *(undefined2 *)&pn[-1].field_0x52;
  if (iVar2 == 0) {
    data[4] = '\0';
    BinarySink_put_byte(pn->output[0].binarysink_,'\x04');
    BinarySink_put_byte(pn->output[0].binarysink_,'\x01');
    BinarySink_put_uint16(pn->output[0].binarysink_,(long)pn->ps->remote_port);
    iVar2 = sk_addrtype(pn->ps->remote_addr);
    if (iVar2 == 1) {
      sk_addrcopy(pn->ps->remote_addr,(char *)data);
      BinarySink_put_data(pn->output[0].binarysink_,data,4);
    }
    else {
      if (iVar2 == 2) {
        pcVar3 = dupstr("SOCKS version 4 does not support IPv6");
        pn->error = pcVar3;
        pn[-1].aborted = false;
        pn[-1].reconnect = false;
        *(undefined2 *)&pn[-1].field_0x52 = 0;
        return;
      }
      if (iVar2 == 4) {
        BinarySink_put_uint32(pn->output[0].binarysink_,1);
        sk_getaddr(pn->ps->remote_addr,(char *)(data + 5),0x200);
        data[4] = '\x01';
      }
    }
    pcVar3 = conf_get_str(pn->ps->conf,0x10);
    BinarySink_put_asciz(pn->output[0].binarysink_,pcVar3);
    if ((data[4] & 1) != 0) {
      BinarySink_put_asciz(pn->output[0].binarysink_,(char *)(data + 5));
    }
    pn[-1].aborted = true;
    pn[-1].reconnect = false;
    *(undefined2 *)&pn[-1].field_0x52 = 0;
  }
  else {
    if (iVar2 == 0x4f) {
      pn[-1].aborted = true;
      pn[-1].reconnect = false;
      *(undefined2 *)&pn[-1].field_0x52 = 0;
    }
    else if (iVar2 != 0x53) {
      pn[-1].aborted = false;
      pn[-1].reconnect = false;
      *(undefined2 *)&pn[-1].field_0x52 = 0;
      return;
    }
    _Var1 = bufchain_try_fetch_consume(pn->input,&local_235,8);
    if (_Var1) {
      if (local_235 == 0) {
        switch(local_234) {
        case 0x5a:
          pn->done = true;
          break;
        case 0x5b:
          pcVar3 = dupstr("SOCKS server reported failure to connect");
          pn->error = pcVar3;
          break;
        case 0x5c:
          pcVar3 = dupstr("SOCKS server wanted IDENTD on client");
          pn->error = pcVar3;
          break;
        case 0x5d:
          pcVar3 = dupstr("Username and IDENTD on client don\'t agree");
          pn->error = pcVar3;
          break;
        default:
          pcVar3 = dupprintf("SOCKS server sent unrecognised error code %d",(ulong)local_234);
          pn->error = pcVar3;
        }
        pn[-1].aborted = false;
        pn[-1].reconnect = false;
        *(undefined2 *)&pn[-1].field_0x52 = 0;
      }
      else {
        pcVar3 = dupprintf("SOCKS proxy response contained reply version number %d (expected 0)",
                           (ulong)local_235);
        pn->error = pcVar3;
        pn[-1].aborted = false;
        pn[-1].reconnect = false;
        *(undefined2 *)&pn[-1].field_0x52 = 0;
      }
    }
  }
  return;
}

Assistant:

static void proxy_socks4_process_queue(ProxyNegotiator *pn)
{
    Socks4ProxyNegotiator *s = container_of(pn, Socks4ProxyNegotiator, pn);

    crBegin(s->crLine);

    {
        char hostname[512];
        bool write_hostname = false;

        /*
         * SOCKS 4 request packet:
         *
         *   byte     version
         *   byte     command
         *   uint16   destination port number
         *   uint32   destination IPv4 address (or something in the
         *            SOCKS4A_NAME_FOLLOWS range)
         *   asciz    username
         *   asciz    destination hostname (if we sent SOCKS4A_NAME_FOLLOWS_*)
         */

        put_byte(pn->output, SOCKS4_REQUEST_VERSION);
        put_byte(pn->output, SOCKS_CMD_CONNECT);
        put_uint16(pn->output, pn->ps->remote_port);

        switch (sk_addrtype(pn->ps->remote_addr)) {
          case ADDRTYPE_IPV4: {
            char addr[4];
            sk_addrcopy(pn->ps->remote_addr, addr);
            put_data(pn->output, addr, 4);
            break;
          }
          case ADDRTYPE_NAME:
            put_uint32(pn->output, SOCKS4A_NAME_FOLLOWS_BASE);
            sk_getaddr(pn->ps->remote_addr, hostname, lenof(hostname));
            write_hostname = true;
            break;
          case ADDRTYPE_IPV6:
            pn->error = dupstr("SOCKS version 4 does not support IPv6");
            crStopV;
        }

        put_asciz(pn->output, conf_get_str(pn->ps->conf, CONF_proxy_username));

        if (write_hostname)
            put_asciz(pn->output, hostname);
    }

    crReturnV;

    {
        unsigned char data[8];
        crMaybeWaitUntilV(bufchain_try_fetch_consume(pn->input, data, 8));

        /*
         * SOCKS 4 response packet:
         *
         *   byte     version
         *   byte     status
         *   uint16   port number
         *   uint32   IPv4 address
         *
         * We don't need to worry about the port and destination address.
         */

        if (data[0] != SOCKS4_REPLY_VERSION) {
            pn->error = dupprintf("SOCKS proxy response contained reply "
                                  "version number %d (expected 0)",
                                  (int)data[0]);
            crStopV;
        }

        switch (data[1]) {
          case SOCKS4_RESP_SUCCESS:
            pn->done = true;
            break;

          case SOCKS4_RESP_FAILURE:
            pn->error = dupstr("SOCKS server reported failure to connect");
            break;

          case SOCKS4_RESP_WANT_IDENTD:
            pn->error = dupstr("SOCKS server wanted IDENTD on client");
            break;

          case SOCKS4_RESP_IDENTD_MISMATCH:
            pn->error = dupstr("Username and IDENTD on client don't agree");
            break;

          default:
            pn->error = dupprintf("SOCKS server sent unrecognised error "
                                  "code %d", (int)data[1]);
            break;
        }
        crStopV;
    }

    crFinishV;
}